

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p256_64.h
# Opt level: O0

void fiat_p256_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t local_d0;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_p256_uint1 x18;
  uint64_t x17;
  uint64_t uStack_98;
  fiat_p256_uint1 x16;
  uint64_t x15;
  uint64_t uStack_88;
  fiat_p256_uint1 x14;
  uint64_t x13;
  uint64_t uStack_78;
  fiat_p256_uint1 x12;
  uint64_t x11;
  uint64_t uStack_68;
  fiat_p256_uint1 x10;
  uint64_t x9;
  uint64_t uStack_58;
  fiat_p256_uint1 x8;
  uint64_t x7;
  uint64_t uStack_48;
  fiat_p256_uint1 x6;
  uint64_t x5;
  uint64_t uStack_38;
  fiat_p256_uint1 x4;
  uint64_t x3;
  uint64_t uStack_28;
  fiat_p256_uint1 x2;
  uint64_t x1;
  uint64_t *arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg2;
  arg2_local = arg1;
  arg1_local = out1;
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffffd8,(fiat_p256_uint1 *)((long)&x3 + 7),'\0',*arg1,*arg2);
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffffc8,(fiat_p256_uint1 *)((long)&x5 + 7),x3._7_1_,arg2_local[1],
             *(uint64_t *)(x1 + 8));
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffffb8,(fiat_p256_uint1 *)((long)&x7 + 7),x5._7_1_,arg2_local[2],
             *(uint64_t *)(x1 + 0x10));
  fiat_p256_addcarryx_u64
            (&stack0xffffffffffffffa8,(fiat_p256_uint1 *)((long)&x9 + 7),x7._7_1_,arg2_local[3],
             *(uint64_t *)(x1 + 0x18));
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffff98,(fiat_p256_uint1 *)((long)&x11 + 7),'\0',uStack_28,
             0xffffffffffffffff);
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffff88,(fiat_p256_uint1 *)((long)&x13 + 7),x11._7_1_,uStack_38,
             0xffffffff);
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffff78,(fiat_p256_uint1 *)((long)&x15 + 7),x13._7_1_,uStack_48,0);
  fiat_p256_subborrowx_u64
            (&stack0xffffffffffffff68,(fiat_p256_uint1 *)((long)&x17 + 7),x15._7_1_,uStack_58,
             0xffffffff00000001);
  fiat_p256_subborrowx_u64
            ((uint64_t *)&stack0xffffffffffffff58,(fiat_p256_uint1 *)((long)&x19 + 7),x17._7_1_,
             (ulong)x9._7_1_,0);
  fiat_p256_cmovznz_u64(&x20,x19._7_1_,uStack_68,uStack_28);
  fiat_p256_cmovznz_u64(&x21,x19._7_1_,uStack_78,uStack_38);
  fiat_p256_cmovznz_u64(&x22,x19._7_1_,uStack_88,uStack_48);
  fiat_p256_cmovznz_u64(&local_d0,x19._7_1_,uStack_98,uStack_58);
  *arg1_local = x20;
  arg1_local[1] = x21;
  arg1_local[2] = x22;
  arg1_local[3] = local_d0;
  return;
}

Assistant:

static FIAT_P256_FIAT_INLINE void fiat_p256_add(fiat_p256_montgomery_domain_field_element out1, const fiat_p256_montgomery_domain_field_element arg1, const fiat_p256_montgomery_domain_field_element arg2) {
  uint64_t x1;
  fiat_p256_uint1 x2;
  uint64_t x3;
  fiat_p256_uint1 x4;
  uint64_t x5;
  fiat_p256_uint1 x6;
  uint64_t x7;
  fiat_p256_uint1 x8;
  uint64_t x9;
  fiat_p256_uint1 x10;
  uint64_t x11;
  fiat_p256_uint1 x12;
  uint64_t x13;
  fiat_p256_uint1 x14;
  uint64_t x15;
  fiat_p256_uint1 x16;
  uint64_t x17;
  fiat_p256_uint1 x18;
  uint64_t x19;
  uint64_t x20;
  uint64_t x21;
  uint64_t x22;
  fiat_p256_addcarryx_u64(&x1, &x2, 0x0, (arg1[0]), (arg2[0]));
  fiat_p256_addcarryx_u64(&x3, &x4, x2, (arg1[1]), (arg2[1]));
  fiat_p256_addcarryx_u64(&x5, &x6, x4, (arg1[2]), (arg2[2]));
  fiat_p256_addcarryx_u64(&x7, &x8, x6, (arg1[3]), (arg2[3]));
  fiat_p256_subborrowx_u64(&x9, &x10, 0x0, x1, UINT64_C(0xffffffffffffffff));
  fiat_p256_subborrowx_u64(&x11, &x12, x10, x3, UINT32_C(0xffffffff));
  fiat_p256_subborrowx_u64(&x13, &x14, x12, x5, 0x0);
  fiat_p256_subborrowx_u64(&x15, &x16, x14, x7, UINT64_C(0xffffffff00000001));
  fiat_p256_subborrowx_u64(&x17, &x18, x16, x8, 0x0);
  fiat_p256_cmovznz_u64(&x19, x18, x9, x1);
  fiat_p256_cmovznz_u64(&x20, x18, x11, x3);
  fiat_p256_cmovznz_u64(&x21, x18, x13, x5);
  fiat_p256_cmovznz_u64(&x22, x18, x15, x7);
  out1[0] = x19;
  out1[1] = x20;
  out1[2] = x21;
  out1[3] = x22;
}